

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::announce_with_tracker(torrent *this,event_t e)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  header_holder_type *phVar3;
  listen_socket_handle *__p;
  string *this_00;
  uint *puVar4;
  byte bVar5;
  byte fail_limit;
  ushort uVar6;
  uint uVar7;
  node_ptr plVar8;
  _func_int *UNRECOVERED_JUMPTABLE;
  pointer pppVar9;
  element_type *peVar10;
  element_type *peVar11;
  session_interface *psVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long *plVar15;
  array<announce_protocol_state,_num_protocols,_protocol_version> *paVar16;
  undefined2 uVar17;
  bool bVar18;
  bool bVar19;
  undefined2 uVar20;
  element_type *peVar21;
  pointer paVar22;
  _Alloc_hider _Var23;
  context *pcVar24;
  bool bVar25;
  bool bVar26;
  int iVar27;
  time_point32 now;
  uint32_t uVar28;
  uint uVar29;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ulong uVar30;
  pointer paVar31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var32;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar33;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  event_t eVar34;
  _func_int **pp_Var35;
  long lVar36;
  pointer paVar37;
  pointer paVar38;
  uint extraout_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  endpoint *ep;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  endpoint *ep_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var39;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  peer_connection **c;
  pointer pppVar40;
  ulong uVar41;
  pointer paVar42;
  ulong uVar43;
  pointer paVar44;
  char *pcVar45;
  optional<long> oVar46;
  protocol_version ih;
  shared_ptr<libtorrent::aux::tracker_logger> tl;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  pointer local_460;
  uint local_454;
  announce_entry *local_450;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_448;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  uint local_41c;
  vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
  listen_socket_states;
  element_type *local_3c8;
  long *local_3c0;
  element_type *local_3b8;
  long *local_3b0;
  string *local_3a8;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *local_3a0;
  pointer local_398;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *local_390;
  pointer local_388;
  undefined1 local_380 [16];
  tracker_request req;
  torrent *local_268;
  tracker_request *ptStack_260;
  service_type *local_258;
  time_type tStack_250;
  undefined1 local_240 [176];
  pointer local_190;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_158;
  tracker_request local_138;
  
  phVar3 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
  plVar8 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar8 == (node_ptr)0x0 || plVar8 == &phVar3->super_node) {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    (*UNRECOVERED_JUMPTABLE)(this,"*** announce: no trackers",phVar3,UNRECOVERED_JUMPTABLE);
    return;
  }
  local_454 = 3;
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    local_454 = (uint)e;
  }
  if ((char)local_454 == '\x03') {
    iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x2e])();
    req.url._M_dataplus._M_p = (pointer)(CONCAT44(extraout_var_00,iVar27) + 0x438);
    req.url._M_string_length = req.url._M_string_length & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&req);
    req.url._M_string_length = CONCAT71(req.url._M_string_length._1_7_,1);
    iVar27 = *(int *)(CONCAT44(extraout_var_00,iVar27) + 0x1b0);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&req);
    if (iVar27 < 1) {
      pp_Var35 = (this->super_request_callback)._vptr_request_callback;
      pcVar45 = "*** announce: event == stopped && stop_tracker_timeout <= 0";
      goto LAB_0031f860;
    }
    if ((char)local_454 == '\x03') goto LAB_0031f815;
  }
  if ((this->field_0x5c0 & 1) == 0) {
    pp_Var35 = (this->super_request_callback)._vptr_request_callback;
    pcVar45 = "*** announce: event != stopped && !m_announce_to_trackers";
  }
  else {
    if (((this->super_torrent_hot_members).field_0x4b & 8) == 0) {
LAB_0031f815:
      if ((char)local_454 == '\0') {
        bVar25 = is_finished(this);
        if (bVar25) {
          bVar25 = is_seed(this);
          local_454 = (uint)CONCAT71(extraout_var,!bVar25 << 2);
        }
        else {
          local_454 = 0;
        }
      }
      req.url._M_dataplus._M_p = (pointer)&req.url.field_2;
      req.url._M_string_length = 0;
      req.url.field_2._M_local_buf[0] = '\0';
      req.trackerid._M_dataplus._M_p = (pointer)&req.trackerid.field_2;
      req.trackerid._M_string_length = 0;
      req.trackerid.field_2._M_local_buf[0] = '\0';
      req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      req.downloaded = -1;
      req.uploaded = -1;
      req.left = -1;
      req.corrupt = 0;
      req.redundant._0_4_ = 0;
      req.redundant._4_4_ = 0;
      req.listen_port = 0;
      req.event = none;
      req.kind.m_val = '\0';
      req.key = 0;
      req.num_want = 0;
      req.ipv6.
      super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      req.ipv6.
      super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      req.ipv6.
      super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      req.ipv4.
      super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      req.ipv4.
      super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      req.ipv4.
      super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      req.info_hash.m_number._M_elems[0] = 0;
      req.info_hash.m_number._M_elems[1] = 0;
      req.info_hash.m_number._M_elems[2] = 0;
      req.info_hash.m_number._M_elems[3] = 0;
      req.info_hash.m_number._M_elems[4] = 0;
      req.pid.m_number._M_elems[0] = 0;
      req.pid.m_number._M_elems[1] = 0;
      req.pid.m_number._M_elems[2] = 0;
      req.pid.m_number._M_elems[3] = 0;
      req.pid.m_number._M_elems[4] = 0;
      req.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           0;
      req.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_6_ =
           0;
      req.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_2_ = 0;
      req.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._2_6_ = 0;
      req.private_torrent = false;
      req.triggered_manually = false;
      req.ssl_ctx = (context *)0x0;
      req.i2pconn = (i2p_connection *)0x0;
      iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(CONCAT44(extraout_var_01,iVar27) + 0x438);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = (uint)tl.
                           super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi & 0xffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 1;
      uVar43 = *(ulong *)(CONCAT44(extraout_var_01,iVar27) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
      if (((uVar43 >> 0x2e & 1) != 0) && ((this->field_0x5db & 2) != 0)) {
        req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (this->m_ip_filter).
                 super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&req.filter.
                    super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(this->m_ip_filter).
                    super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      req.private_torrent =
           (bool)((((this->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_flags).m_val >> 1 & 1);
      uVar13 = *(undefined8 *)(this->m_peer_id).m_number._M_elems;
      uVar14 = *(undefined8 *)((this->m_peer_id).m_number._M_elems + 2);
      req.pid.m_number._M_elems[0] = (uint)uVar13;
      req.pid.m_number._M_elems[1] = (uint)((ulong)uVar13 >> 0x20);
      req.pid.m_number._M_elems[2] = (uint)uVar14;
      req.pid.m_number._M_elems[3] = (uint)((ulong)uVar14 >> 0x20);
      req.pid.m_number._M_elems[4] = (this->m_peer_id).m_number._M_elems[4];
      req.corrupt = this->m_total_failed_bytes;
      req.downloaded =
           *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x20 - req.corrupt;
      req.uploaded = *(int64_t *)
                      &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>;
      oVar46 = bytes_left(this);
      req.left = 0x4000;
      if (((undefined1  [16])
           oVar46.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        req.left = oVar46.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
      }
      req.ssl_ctx = (this->m_ssl_ctx)._M_t.
                    super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                    .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
      req.redundant._0_4_ = (undefined4)this->m_total_redundant_bytes;
      req.redundant._4_4_ = (undefined4)((ulong)this->m_total_redundant_bytes >> 0x20);
      iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(CONCAT44(extraout_var_02,iVar27) + 0x438);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = (uint)tl.
                           super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi & 0xffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 1;
      uVar7 = *(uint *)(CONCAT44(extraout_var_02,iVar27) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
      if ((uVar7 >> 0x1d & 1) == 0) {
        req.downloaded = req.downloaded - this->m_total_redundant_bytes;
        bVar25 = is_seed(this);
        if (bVar25) {
          pppVar9 = (this->super_torrent_hot_members).m_connections.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pppVar40 = (this->super_torrent_hot_members).m_connections.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; pppVar40 != pppVar9;
              pppVar40 = pppVar40 + 1) {
            (*((*pppVar40)->super_bandwidth_socket)._vptr_bandwidth_socket[0x1c])();
            if (0 < (int)extraout_EDX) {
              req.downloaded = req.downloaded - (ulong)(extraout_EDX & 0x7fffffff);
              req.redundant = req.redundant + (ulong)(extraout_EDX & 0x7fffffff);
            }
          }
        }
      }
      if (req.downloaded < 0) {
        req.downloaded = 0;
      }
      req.event = (event_t)local_454;
      iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(CONCAT44(extraout_var_03,iVar27) + 0x438);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = (uint)tl.
                           super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi & 0xffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 1;
      uVar43 = *(ulong *)(CONCAT44(extraout_var_03,iVar27) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
      if ((((uVar43 >> 0x26 & 1) == 0) &&
          (peVar10 = (this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          , peVar10 != (element_type *)0x0)) && (((peVar10->m_flags).m_val & 2) != 0)) {
        ptStack_260 = &req;
        tStack_250.__d.__r =
             (duration)
             ::std::
             _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3082:33)>
             ::_M_invoke;
        local_258 = (service_type *)
                    ::std::
                    _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3082:33)>
                    ::_M_manager;
        local_268 = this;
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x24])();
        if (local_258 != (service_type *)0x0) {
          (*(code *)local_258)(&local_268,&local_268,3);
        }
      }
      iVar27 = 0;
      if (req.event != stopped) {
        iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(CONCAT44(extraout_var_04,iVar27) + 0x438);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ =
             (uint)tl.
                   super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi & 0xffffff00;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 1;
        iVar27 = *(int *)(CONCAT44(extraout_var_04,iVar27) + 0x200);
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
      }
      req.num_want = iVar27;
      bVar25 = digest32<160L>::is_all_zeros(&(this->m_info_hash).v1);
      bVar26 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
      supports_protocol.super_array<const_bool,_2UL>._M_elems[1] = !bVar26;
      supports_protocol.super_array<const_bool,_2UL>._M_elems[0] = !bVar25;
      now = time_now32();
      listen_socket_states.
      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      listen_socket_states.
      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      listen_socket_states.
      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar27 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar27 != '\0') {
        iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(CONCAT44(extraout_var_05,iVar27) + 0x438);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ =
             (uint)tl.
                   super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi & 0xffffff00;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 1;
        uVar7 = *(uint *)(CONCAT44(extraout_var_05,iVar27) + 0x428);
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
        iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(CONCAT44(extraout_var_06,iVar27) + 0x438);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 0;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 1;
        uVar29 = *(uint *)(CONCAT44(extraout_var_06,iVar27) + 0x428);
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,
                   "*** announce: [ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
                   ,(ulong)(uVar7 >> 0x11 & 1),(ulong)(uVar29 >> 0x12 & 1));
      }
      local_450 = (announce_entry *)(phVar3->super_node).next_;
      if (local_450 != (announce_entry *)phVar3) {
        local_3a8 = &this->m_trackerid;
        local_3a0 = (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                    &this->super_enable_shared_from_this<libtorrent::aux::torrent>;
        local_41c = 0xffffffff;
        do {
          anon_unknown_135::refresh_endpoint_list
                    ((this->super_torrent_hot_members).m_ses,
                     (bool)((byte)((uint)*(undefined4 *)&this->field_0x5dd >> 0x19) & 1),
                     (bool)((byte)this->field_0x606 >> 6 & 1),local_450);
          ::std::__cxx11::string::_M_assign((string *)&req.trackerid);
          ::std::__cxx11::string::_M_assign((string *)&req);
          bVar25 = is_i2p_url((string *)&req);
          local_41c = local_41c + 1;
          p_Var39 = extraout_RDX;
          if (bVar25) {
            req.kind.m_val = req.kind.m_val | 2;
LAB_0031fdf7:
            local_460 = (local_450->endpoints).
                        super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_398 = (local_450->endpoints).
                        super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (local_460 != local_398) {
              do {
                paVar37 = listen_socket_states.
                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                paVar38 = listen_socket_states.
                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar43 = (long)listen_socket_states.
                               super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)listen_socket_states.
                               super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                paVar31 = listen_socket_states.
                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < (long)uVar43 >> 7) {
                  p_Var39 = (local_460->socket).m_sock.
                            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  paVar31 = (pointer)((long)&(((announce_state *)
                                              (&(listen_socket_states.
                                                 super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->state +
                                              -1))->socket).m_sock.
                                             super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (uVar43 & 0xffffffffffffff80));
                  lVar36 = ((long)uVar43 >> 7) + 1;
                  paVar42 = listen_socket_states.
                            super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2;
                  do {
                    if (p_Var39 ==
                        paVar42[-2].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
                      paVar42 = paVar42 + -2;
                      goto LAB_0031ff01;
                    }
                    if (p_Var39 ==
                        paVar42[-1].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
                      paVar42 = paVar42 + -1;
                      goto LAB_0031ff01;
                    }
                    if (p_Var39 ==
                        (paVar42->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) goto LAB_0031ff01;
                    if (p_Var39 ==
                        paVar42[1].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
                      paVar42 = paVar42 + 1;
                      goto LAB_0031ff01;
                    }
                    lVar36 = lVar36 + -1;
                    paVar42 = paVar42 + 4;
                  } while (1 < lVar36);
                }
                lVar36 = (long)listen_socket_states.
                               super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar31 >> 5;
                if (lVar36 == 1) {
LAB_0031fed8:
                  paVar42 = paVar31;
                  if ((local_460->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi !=
                      (paVar31->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi) {
                    paVar42 = listen_socket_states.
                              super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                else if (lVar36 == 2) {
LAB_0031fec2:
                  paVar42 = paVar31;
                  if ((local_460->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi !=
                      (paVar31->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi) {
                    paVar31 = paVar31 + 1;
                    goto LAB_0031fed8;
                  }
                }
                else {
                  paVar42 = listen_socket_states.
                            super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if ((lVar36 == 3) &&
                     (paVar42 = paVar31,
                     (local_460->socket).m_sock.
                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi !=
                     (paVar31->socket).m_sock.
                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)) {
                    paVar31 = paVar31 + 1;
                    goto LAB_0031fec2;
                  }
                }
LAB_0031ff01:
                if (paVar42 ==
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  __p = &local_460->socket;
                  if (listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    if (uVar43 == 0x7fffffffffffffe0) {
                      ::std::__throw_length_error("vector::_M_realloc_insert");
                    }
                    uVar43 = (long)uVar43 >> 5;
                    uVar30 = uVar43;
                    if (listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      uVar30 = 1;
                    }
                    uVar41 = uVar30 + uVar43;
                    if (0x3fffffffffffffe < uVar41) {
                      uVar41 = 0x3ffffffffffffff;
                    }
                    if (CARRY8(uVar30,uVar43)) {
                      uVar41 = 0x3ffffffffffffff;
                    }
                    if (uVar41 == 0) {
                      paVar31 = (pointer)0x0;
                    }
                    else {
                      paVar31 = (pointer)operator_new(uVar41 << 5);
                      p_Var39 = extraout_RDX_02;
                    }
                    ::std::
                    allocator_traits<std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>>
                    ::
                    construct<libtorrent::aux::(anonymous_namespace)::announce_state,libtorrent::aux::listen_socket_handle&>
                              ((allocator_type *)(paVar31 + uVar43),(announce_state *)__p,
                               (listen_socket_handle *)p_Var39);
                    p_Var39 = extraout_RDX_03;
                    paVar42 = paVar31;
                    for (paVar44 = paVar38; paVar37 != paVar44; paVar44 = paVar44 + 1) {
                      (paVar42->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (paVar44->socket).m_sock.
                                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      (paVar42->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi =
                           (paVar44->socket).m_sock.
                           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                      (paVar44->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)0x0;
                      (paVar44->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      bVar25 = (paVar44->state).
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               ._M_elems[0].sent_announce;
                      bVar26 = (paVar44->state).
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               ._M_elems[0].done;
                      uVar17 = *(undefined2 *)
                                &(paVar44->state).
                                 super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                 ._M_elems[0].field_0x6;
                      iVar27 = (paVar44->state).
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               ._M_elems[1].tier;
                      paVar16 = &paVar44->state;
                      bVar18 = (paVar16->
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               )._M_elems[1].sent_announce;
                      bVar19 = (paVar16->
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               )._M_elems[1].done;
                      uVar20 = *(undefined2 *)
                                &(paVar16->
                                 super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                 )._M_elems[1].field_0x6;
                      (paVar42->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[0].tier =
                           (paVar44->state).
                           super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                           ._M_elems[0].tier;
                      (paVar42->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[0].sent_announce = bVar25;
                      (paVar42->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[0].done = bVar26;
                      *(undefined2 *)
                       &(paVar42->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                        ._M_elems[0].field_0x6 = uVar17;
                      (paVar42->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[1].tier = iVar27;
                      paVar16 = &paVar42->state;
                      (paVar16->
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      )._M_elems[1].sent_announce = bVar18;
                      (paVar16->
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      )._M_elems[1].done = bVar19;
                      *(undefined2 *)
                       &(paVar16->
                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                        )._M_elems[1].field_0x6 = uVar20;
                      p_Var32 = (paVar44->socket).m_sock.
                                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                      if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var1 = &p_Var32->_M_weak_count;
                          iVar27 = *p_Var1;
                          *p_Var1 = *p_Var1 + -1;
                          UNLOCK();
                        }
                        else {
                          iVar27 = p_Var32->_M_weak_count;
                          p_Var32->_M_weak_count = iVar27 + -1;
                        }
                        if (iVar27 == 1) {
                          (*p_Var32->_vptr__Sp_counted_base[3])();
                          p_Var39 = extraout_RDX_04;
                        }
                      }
                      paVar42 = paVar42 + 1;
                    }
                    if (paVar38 != (pointer)0x0) {
                      operator_delete(paVar38,(long)listen_socket_states.
                                                                                                        
                                                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)paVar38);
                      p_Var39 = extraout_RDX_05;
                    }
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_start = paVar31;
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish = paVar42 + 1;
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = paVar31 + uVar41;
                  }
                  else {
                    ::std::
                    allocator_traits<std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>>
                    ::
                    construct<libtorrent::aux::(anonymous_namespace)::announce_state,libtorrent::aux::listen_socket_handle&>
                              ((allocator_type *)
                               listen_socket_states.
                               super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(announce_state *)__p,
                               (listen_socket_handle *)p_Var39);
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish = paVar37 + 1;
                    p_Var39 = extraout_RDX_01;
                  }
                  paVar42 = listen_socket_states.
                            super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1;
                }
                paVar22 = local_460;
                if ((local_460->field_0xb0 & 1) != 0) {
                  local_390 = &(local_460->socket).m_sock.
                               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount;
                  lVar36 = 0;
                  do {
                    ih = (&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar36];
                    p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)ih;
                    if (((supports_protocol.super_array<const_bool,_2UL>._M_elems[(long)p_Var32] !=
                          true) ||
                        ((local_448 = p_Var32,
                         ((paVar22->info_hashes).
                          super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
                          [(long)p_Var32].field_0x45 & 1) == 0 && (req.event == stopped)))) ||
                       ((paVar42->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                        ._M_elems[(long)p_Var32].done != false)) goto LAB_00320b10;
                    iVar27 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
                    this_00 = &(paVar22->info_hashes).
                               super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
                               [(long)p_Var32].message;
                    if ((char)iVar27 != '\0') {
                      print_endpoint_abi_cxx11_((string *)&tl,(aux *)local_460,ep);
                      p_Var39 = local_448;
                      peVar21 = tl.
                                super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      local_388 = (local_450->url)._M_dataplus._M_p;
                      bVar5 = local_450->tier;
                      uVar7 = (paVar42->state).
                              super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                              ._M_elems[(long)local_448].tier;
                      uVar6 = *(ushort *)((long)(this_00 + 2) + 4);
                      fail_limit = local_450->fail_limit;
                      bVar25 = is_seed(this);
                      bVar25 = announce_infohash::can_announce
                                         ((announce_infohash *)this_00,
                                          (time_point)((long)(int)now.__d.__r * 1000000000),bVar25,
                                          fail_limit);
                      (*(this->super_request_callback)._vptr_request_callback[7])
                                (this,
                                 "*** tracker:  (%d) [ep: %s ] \"%s\" [  i->tier: %d tier: %d working: %d limit: %d can: %d sent: %d ]"
                                 ,(ulong)local_41c,peVar21,local_388,(ulong)bVar5,(ulong)uVar7,
                                 (ulong)((uVar6 & 0x7f) == 0),(ulong)fail_limit,(ulong)bVar25,
                                 (ulong)(paVar42->state).
                                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                        ._M_elems[(long)p_Var39].sent_announce);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)tl.
                             super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr != &local_478) {
                        operator_delete(tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,CONCAT44(local_478._M_allocated_capacity._4_4_,
                                                         local_478._M_allocated_capacity._0_4_) + 1)
                        ;
                      }
                    }
                    iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                               _vptr_session_logger[0x2e])();
                    tl.
                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)(CONCAT44(extraout_var_08,iVar27) + 0x438);
                    tl.
                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._0_4_ =
                         (uint)tl.
                               super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi & 0xffffff00;
                    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                    tl.
                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._0_1_ = 1;
                    uVar7 = *(uint *)(CONCAT44(extraout_var_08,iVar27) + 0x428);
                    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
                    if ((uVar7 >> 0x11 & 1) != 0) {
                      iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger[0x2e])();
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)(CONCAT44(extraout_var_09,iVar27) + 0x438);
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_4_ =
                           (uint)tl.
                                 super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi & 0xffffff00;
                      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_1_ = 1;
                      uVar7 = *(uint *)(CONCAT44(extraout_var_09,iVar27) + 0x428);
                      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
                      if ((((uVar7 >> 0x12 & 1) == 0) &&
                          ((paVar42->state).
                           super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                           ._M_elems[(long)local_448].sent_announce == true)) &&
                         (iVar27 = (paVar42->state).
                                   super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                   ._M_elems[(long)local_448].tier, p_Var39 = local_448,
                         (int)(uint)local_450->tier <= iVar27 && iVar27 != 0x7fffffff))
                      goto LAB_00320b10;
                    }
                    if (((paVar42->state).
                         super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                         ._M_elems[(long)local_448].tier < (int)(uint)local_450->tier) &&
                       ((paVar42->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                        ._M_elems[(long)local_448].sent_announce == true)) {
                      iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger[0x2e])();
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)(CONCAT44(extraout_var_10,iVar27) + 0x438);
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_4_ =
                           (uint)tl.
                                 super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi & 0xffffff00;
                      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_1_ = 1;
                      uVar7 = *(uint *)(CONCAT44(extraout_var_10,iVar27) + 0x428);
                      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
                      p_Var39 = extraout_RDX_06;
                      if ((uVar7 >> 0x11 & 1) == 0) goto LAB_00320b10;
                    }
                    if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                      (paVar42->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(long)local_448].tier = (uint)local_450->tier;
                      (paVar42->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(long)local_448].sent_announce = false;
                    }
                    bVar25 = is_seed(this);
                    bVar25 = announce_infohash::can_announce
                                       ((announce_infohash *)this_00,
                                        (time_point)((long)(int)now.__d.__r * 1000000000),bVar25,
                                        local_450->fail_limit);
                    if (bVar25) {
                      req.event = (event_t)local_454;
                      if (req.event == none) {
                        eVar34 = started;
                        if ((*(uint *)((long)(this_00 + 2) + 4) >> 8 & 1) == 0) {
LAB_003203d7:
                          req.event = eVar34;
                        }
                        else if (((*(uint *)((long)(this_00 + 2) + 4) >> 9 & 1) == 0) &&
                                ((this->field_0x606 & 0x40) == 0)) {
                          bVar25 = is_seed(this);
                          eVar34 = completed;
                          if (bVar25) goto LAB_003203d7;
                        }
                      }
                      req.triggered_manually =
                           (bool)((byte)((ushort)*(undefined2 *)((long)(this_00 + 2) + 4) >> 10) & 1
                                 );
                      *(undefined1 *)((long)(this_00 + 2) + 5) =
                           *(undefined1 *)((long)(this_00 + 2) + 5) & 0xfb;
                      uVar28 = tracker_key(this);
                      req.key = uVar28;
                      peVar11 = (local_460->socket).m_sock.
                                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      req.outgoing_socket.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._0_2_ = SUB82(peVar11,0);
                      req.outgoing_socket.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._2_6_ = (undefined6)((ulong)peVar11 >> 0x10);
                      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                                (&req.outgoing_socket.m_sock.
                                  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,local_390);
                      lVar33 = 0x244;
                      if (ih == V1) {
                        lVar33 = 0x230;
                      }
                      peVar10 = (this->super_torrent_hot_members).m_torrent_file.
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      local_478._M_allocated_capacity._0_4_ =
                           *(uint *)((long)&(peVar10->m_files).m_files.
                                            super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                                            .
                                            super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar33);
                      puVar4 = (uint *)((long)&(peVar10->m_files).m_piece_length + lVar33);
                      req.info_hash.m_number._M_elems._0_8_ = *(undefined8 *)puVar4;
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = *(element_type **)puVar4;
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_4_ = puVar4[2];
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_ = puVar4[3];
                      req.info_hash.m_number._M_elems._8_8_ = *(undefined8 *)(puVar4 + 2);
                      req.info_hash.m_number._M_elems[4] = local_478._M_allocated_capacity._0_4_;
                      iVar27 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
                      pcVar24 = req.ssl_ctx;
                      _Var23 = req.url._M_dataplus;
                      if ((char)iVar27 != '\0') {
                        pcVar45 = "";
                        if (req.event == started) {
                          pcVar45 = "started";
                        }
                        if (req.event == stopped) {
                          pcVar45 = "stopped";
                        }
                        uVar7 = *(uint *)&(this->super_torrent_hot_members).field_0x48;
                        iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger[0x20])();
                        uVar29 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger[0x21])();
                        uVar6 = *(ushort *)((long)(this_00 + 2) + 4);
                        print_endpoint_abi_cxx11_((string *)&tl,(aux *)local_460,ep_00);
                        (*(this->super_request_callback)._vptr_request_callback[7])
                                  (this,
                                   "==> TRACKER REQUEST \"%s\" event: %s abort: %d ssl: %p port: %d ssl-port: %d fails: %d upd: %d ep: %s"
                                   ,_Var23._M_p,pcVar45,(ulong)(uVar7 >> 0x1a & 1),pcVar24,
                                   (short)iVar27,(ulong)(uVar29 & 0xffff),(ulong)(uVar6 & 0x7f),
                                   (ulong)(uVar6 >> 7 & 1),
                                   tl.
                                   super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)tl.
                               super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr != &local_478) {
                          operator_delete(tl.
                                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr,CONCAT44(local_478._M_allocated_capacity._4_4_,
                                                           local_478._M_allocated_capacity._0_4_) +
                                                  1);
                        }
                      }
                      if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
LAB_003206b5:
                        psVar12 = (this->super_torrent_hot_members).m_ses;
                        tracker_request::tracker_request((tracker_request *)local_240,&req);
                        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr<libtorrent::aux::torrent,void>
                                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>
                                    *)&tl,local_3a0);
                        local_3c0 = (long *)CONCAT44(tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._4_4_,
                                                  (uint)tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                        local_3c8 = tl.
                                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr;
                        if (local_3c0 != (long *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            *(int *)((long)local_3c0 + 0xc) = *(int *)((long)local_3c0 + 0xc) + 1;
                            UNLOCK();
                          }
                          else {
                            *(int *)((long)local_3c0 + 0xc) = *(int *)((long)local_3c0 + 0xc) + 1;
                          }
                        }
                        (*(psVar12->super_session_logger)._vptr_session_logger[0x2f])
                                  (psVar12,local_240,&local_3c8);
                        if (local_3c0 != (long *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            piVar2 = (int *)((long)local_3c0 + 0xc);
                            iVar27 = *piVar2;
                            *piVar2 = *piVar2 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar27 = *(int *)((long)local_3c0 + 0xc);
                            *(int *)((long)local_3c0 + 0xc) = iVar27 + -1;
                          }
                          if (iVar27 == 1) {
                            (**(code **)(*local_3c0 + 0x18))();
                          }
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            CONCAT44(tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_,
                                     (uint)tl.
                                           super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi) !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     CONCAT44(tl.
                                              super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi._4_4_,
                                              (uint)tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi));
                        }
                        if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                        {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            p_Var1 = &(local_158._M_pi)->_M_weak_count;
                            iVar27 = *p_Var1;
                            *p_Var1 = *p_Var1 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar27 = (local_158._M_pi)->_M_weak_count;
                            (local_158._M_pi)->_M_weak_count = iVar27 + -1;
                          }
                          if (iVar27 == 1) {
                            (*(local_158._M_pi)->_vptr__Sp_counted_base[3])();
                          }
                        }
                        if ((pointer)local_240._160_8_ != (pointer)0x0) {
                          operator_delete((void *)local_240._160_8_,
                                          (long)local_190 - local_240._160_8_);
                        }
                        if ((per_timer_data *)local_240._136_8_ != (per_timer_data *)0x0) {
                          operator_delete((void *)local_240._136_8_,
                                          local_240._152_8_ - local_240._136_8_);
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._72_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_240._72_8_);
                        }
                        if ((undefined1 *)local_240._32_8_ != local_240 + 0x30) {
                          operator_delete((void *)local_240._32_8_,local_240._48_8_ + 1);
                        }
                        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
                          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
                        }
                      }
                      else {
                        iVar27 = (**(((this->super_torrent_hot_members).m_ses)->super_session_logger
                                    )._vptr_session_logger)();
                        if ((char)iVar27 == '\0') goto LAB_003206b5;
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)0x0;
                        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<libtorrent::aux::tracker_logger,std::allocator<libtorrent::aux::tracker_logger>,libtorrent::aux::session_interface&>
                                  (&tl.
                                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(tracker_logger **)&tl,
                                   (allocator<libtorrent::aux::tracker_logger> *)local_380,
                                   (this->super_torrent_hot_members).m_ses);
                        psVar12 = (this->super_torrent_hot_members).m_ses;
                        tracker_request::tracker_request(&local_138,&req);
                        local_3b0 = (long *)CONCAT44(tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._4_4_,
                                                  (uint)tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                        local_3b8 = tl.
                                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr;
                        if (local_3b0 != (long *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            *(int *)((long)local_3b0 + 0xc) = *(int *)((long)local_3b0 + 0xc) + 1;
                            UNLOCK();
                          }
                          else {
                            *(int *)((long)local_3b0 + 0xc) = *(int *)((long)local_3b0 + 0xc) + 1;
                          }
                        }
                        (*(psVar12->super_session_logger)._vptr_session_logger[0x2f])
                                  (psVar12,&local_138,&local_3b8);
                        if (local_3b0 != (long *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            piVar2 = (int *)((long)local_3b0 + 0xc);
                            iVar27 = *piVar2;
                            *piVar2 = *piVar2 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar27 = *(int *)((long)local_3b0 + 0xc);
                            *(int *)((long)local_3b0 + 0xc) = iVar27 + -1;
                          }
                          if (iVar27 == 1) {
                            (**(code **)(*local_3b0 + 0x18))();
                          }
                        }
                        if (local_138.outgoing_socket.m_sock.
                            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            p_Var1 = &(local_138.outgoing_socket.m_sock.
                                       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_weak_count;
                            iVar27 = *p_Var1;
                            *p_Var1 = *p_Var1 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar27 = (local_138.outgoing_socket.m_sock.
                                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_weak_count;
                            (local_138.outgoing_socket.m_sock.
                             super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_weak_count = iVar27 + -1;
                          }
                          if (iVar27 == 1) {
                            (*(local_138.outgoing_socket.m_sock.
                               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
                          }
                        }
                        if (local_138.ipv4.
                            super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_138.ipv4.
                                          super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_138.ipv4.
                                                super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_138.ipv4.
                                                super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_138.ipv6.
                            super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_138.ipv6.
                                          super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_138.ipv6.
                                                super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_138.ipv6.
                                                super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_138.filter.
                            super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_138.filter.
                                     super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.trackerid._M_dataplus._M_p != &local_138.trackerid.field_2)
                        {
                          operator_delete(local_138.trackerid._M_dataplus._M_p,
                                          local_138.trackerid.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.url._M_dataplus._M_p != &local_138.url.field_2) {
                          operator_delete(local_138.url._M_dataplus._M_p,
                                          local_138.url.field_2._M_allocated_capacity + 1);
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            CONCAT44(tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_,
                                     (uint)tl.
                                           super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi) !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     CONCAT44(tl.
                                              super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi._4_4_,
                                              (uint)tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi));
                        }
                      }
                      *(undefined1 *)((long)(this_00 + 2) + 4) =
                           *(undefined1 *)((long)(this_00 + 2) + 4) | 0x80;
                      (((time_point32 *)((error_code *)(this_00 + 1) + 1))->__d).__r =
                           (rep_conflict)now.__d.__r;
                      ((time_point32 *)((error_code *)(this_00 + 1) + 1))[1].__d.__r =
                           (rep_conflict)now.__d.__r;
                      iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger[5])();
                      p_Var39 = extraout_RDX_09;
                      if ((*(uint *)(CONCAT44(extraout_var_13,iVar27) + 0x68) & 0x10) != 0) {
                        iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger[5])();
                        get_handle((torrent *)local_380);
                        alert_manager::
                        emplace_alert<libtorrent::tracker_announce_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,std::__cxx11::string&,libtorrent::protocol_version_const&,libtorrent::event_t&>
                                  ((alert_manager *)CONCAT44(extraout_var_14,iVar27),
                                   (torrent_handle *)local_380,&local_460->local_endpoint,&req.url,
                                   &ih,&req.event);
                        p_Var39 = extraout_RDX_10;
                        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             )local_380._8_8_ !=
                            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             )0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            piVar2 = (int *)(local_380._8_8_ + 0xc);
                            iVar27 = *piVar2;
                            *piVar2 = *piVar2 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar27 = *(int *)(local_380._8_8_ + 0xc);
                            *(int *)(local_380._8_8_ + 0xc) = iVar27 + -1;
                          }
                          if (iVar27 == 1) {
                            (**(code **)(*(long *)local_380._8_8_ + 0x18))();
                            p_Var39 = extraout_RDX_11;
                          }
                        }
                      }
                      (paVar42->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(long)local_448].sent_announce = true;
                      if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                        iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger[0x2e])();
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)(CONCAT44(extraout_var_15,iVar27) + 0x438);
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_4_ =
                             (uint)tl.
                                   super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi & 0xffffff00;
                        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_1_ = 1;
                        uVar7 = *(uint *)(CONCAT44(extraout_var_15,iVar27) + 0x428);
                        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl)
                        ;
                        p_Var39 = extraout_RDX_12;
                        if ((uVar7 >> 0x12 & 1) == 0) {
                          iVar27 = (*(((this->super_torrent_hot_members).m_ses)->
                                     super_session_logger)._vptr_session_logger[0x2e])();
                          lVar33 = CONCAT44(extraout_var_16,iVar27);
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = (element_type *)(lVar33 + 0x438);
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._0_4_ =
                               (uint)tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi & 0xffffff00;
                          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
LAB_00320ae5:
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._0_1_ = 1;
                          uVar7 = *(uint *)(lVar33 + 0x428);
                          ::std::unique_lock<std::mutex>::~unique_lock
                                    ((unique_lock<std::mutex> *)&tl);
                          p_Var39 = extraout_RDX_13;
                          if ((uVar7 >> 0x11 & 1) == 0) {
                            (paVar42->state).
                            super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                            ._M_elems[(long)local_448].done = true;
                          }
                        }
                      }
                    }
                    else {
                      p_Var39 = extraout_RDX_07;
                      if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                        (paVar42->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                        ._M_elems[(long)local_448].sent_announce = true;
                        iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger[0x2e])();
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)(CONCAT44(extraout_var_11,iVar27) + 0x438);
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_4_ =
                             (uint)tl.
                                   super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi & 0xffffff00;
                        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_1_ = 1;
                        uVar7 = *(uint *)(CONCAT44(extraout_var_11,iVar27) + 0x428);
                        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl)
                        ;
                        p_Var39 = extraout_RDX_08;
                        if ((uVar7 >> 0x12 & 1) == 0) {
                          iVar27 = (*(((this->super_torrent_hot_members).m_ses)->
                                     super_session_logger)._vptr_session_logger[0x2e])();
                          lVar33 = CONCAT44(extraout_var_12,iVar27);
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = (element_type *)(lVar33 + 0x438);
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._0_4_ =
                               (uint)tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi & 0xffffff00;
                          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                          goto LAB_00320ae5;
                        }
                      }
                    }
LAB_00320b10:
                    lVar36 = lVar36 + 1;
                  } while (lVar36 != 2);
                }
                local_460 = local_460 + 1;
              } while (local_460 != local_398);
            }
            tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     CONCAT62(tl.
                              super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._2_6_,supports_protocol.super_array<const_bool,_2UL>._M_elems)
            ;
            lVar36 = (long)listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 7;
            paVar38 = listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (0 < lVar36) {
              paVar38 = (pointer)((long)&(((announce_state *)
                                          (&(listen_socket_states.
                                             super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->state + -1)
                                          )->socket).m_sock.
                                         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr +
                                 ((long)listen_socket_states.
                                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)listen_socket_states.
                                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                        ._M_impl.super__Vector_impl_data._M_start &
                                 0xffffffffffffff80U));
              paVar37 = listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                bVar25 = false;
                lVar33 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar33]) == '\x01') &&
                     ((paVar37->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar33]].
                      done != true)) break;
                  lVar33 = lVar33 + 1;
                  bVar25 = lVar33 == 2;
                } while (!bVar25);
                if (!bVar25) goto LAB_00320d08;
                bVar25 = false;
                lVar33 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar33]) == '\x01') &&
                     (paVar37[1].state.
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar33]].
                      done != true)) break;
                  lVar33 = lVar33 + 1;
                  bVar25 = lVar33 == 2;
                } while (!bVar25);
                if (!bVar25) {
                  paVar37 = paVar37 + 1;
                  goto LAB_00320d08;
                }
                bVar25 = false;
                lVar33 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar33]) == '\x01') &&
                     (paVar37[2].state.
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar33]].
                      done != true)) break;
                  lVar33 = lVar33 + 1;
                  bVar25 = lVar33 == 2;
                } while (!bVar25);
                if (!bVar25) {
                  paVar37 = paVar37 + 2;
                  goto LAB_00320d08;
                }
                bVar25 = false;
                lVar33 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar33]) == '\x01') &&
                     (paVar37[3].state.
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar33]].
                      done != true)) break;
                  lVar33 = lVar33 + 1;
                  bVar25 = lVar33 == 2;
                } while (!bVar25);
                if (!bVar25) {
                  paVar37 = paVar37 + 3;
                  goto LAB_00320d08;
                }
                paVar37 = paVar37 + 4;
                bVar25 = 1 < lVar36;
                lVar36 = lVar36 + -1;
              } while (bVar25);
            }
            lVar36 = (long)listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)paVar38 >> 5;
            if (lVar36 == 1) {
LAB_00320cc9:
              bVar25 = false;
              lVar36 = 0;
              do {
                if ((*(char *)((long)&tl.
                                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar36]) == '\x01') &&
                   ((paVar38->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                    ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar36]].done
                    != true)) break;
                lVar36 = lVar36 + 1;
                bVar25 = lVar36 == 2;
              } while (!bVar25);
              paVar37 = paVar38;
              if (bVar25) {
                paVar37 = listen_socket_states.
                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            else if (lVar36 == 2) {
LAB_00320c9d:
              bVar25 = false;
              lVar36 = 0;
              do {
                if ((*(char *)((long)&tl.
                                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar36]) == '\x01') &&
                   ((paVar38->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                    ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar36]].done
                    != true)) break;
                lVar36 = lVar36 + 1;
                bVar25 = lVar36 == 2;
              } while (!bVar25);
              paVar37 = paVar38;
              if (bVar25) {
                paVar38 = paVar38 + 1;
                goto LAB_00320cc9;
              }
            }
            else {
              paVar37 = listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (lVar36 == 3) {
                bVar25 = false;
                lVar36 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar36]) == '\x01') &&
                     ((paVar38->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar36]].
                      done != true)) break;
                  lVar36 = lVar36 + 1;
                  bVar25 = lVar36 == 2;
                } while (!bVar25);
                paVar37 = paVar38;
                if (bVar25) {
                  paVar38 = paVar38 + 1;
                  goto LAB_00320c9d;
                }
              }
            }
LAB_00320d08:
            iVar27 = 0;
            if (paVar37 ==
                listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              iVar27 = 0xe;
            }
          }
          else {
            if (-1 < (char)this->field_0x5cc) goto LAB_0031fdf7;
            iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[0x2e])();
            tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)(CONCAT44(extraout_var_07,iVar27) + 0x438);
            tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_4_ =
                 (uint)tl.
                       super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi & 0xffffff00;
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
            tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_1_ = 1;
            uVar7 = *(uint *)(CONCAT44(extraout_var_07,iVar27) + 0x428);
            ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
            iVar27 = 0xf;
            p_Var39 = extraout_RDX_00;
            if ((uVar7 >> 0x17 & 1) != 0) goto LAB_0031fdf7;
          }
        } while (((iVar27 == 0xf) || (iVar27 == 0)) &&
                (local_450 = (announce_entry *)(local_450->list_hook).super_type.super_type.next_,
                local_450 != (announce_entry *)phVar3));
      }
      update_tracker_timer(this,now);
      ::std::
      vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
      ::~vector(&listen_socket_states);
      plVar15 = (long *)CONCAT62(req.outgoing_socket.m_sock.
                                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._2_6_,
                                 req.outgoing_socket.m_sock.
                                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._0_2_);
      if (plVar15 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)plVar15 + 0xc);
          iVar27 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar27 = *(int *)((long)plVar15 + 0xc);
          *(int *)((long)plVar15 + 0xc) = iVar27 + -1;
        }
        if (iVar27 == 1) {
          (**(code **)(*plVar15 + 0x18))();
        }
      }
      if (req.ipv4.
          super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(req.ipv4.
                        super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)req.ipv4.
                              super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)req.ipv4.
                              super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (req.ipv6.
          super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(req.ipv6.
                        super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)req.ipv6.
                              super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)req.ipv6.
                              super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (req.filter.
                   super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)req.trackerid._M_dataplus._M_p != &req.trackerid.field_2) {
        operator_delete(req.trackerid._M_dataplus._M_p,
                        CONCAT71(req.trackerid.field_2._M_allocated_capacity._1_7_,
                                 req.trackerid.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)req.url._M_dataplus._M_p == &req.url.field_2) {
        return;
      }
      operator_delete(req.url._M_dataplus._M_p,
                      CONCAT71(req.url.field_2._M_allocated_capacity._1_7_,
                               req.url.field_2._M_local_buf[0]) + 1);
      return;
    }
    pp_Var35 = (this->super_request_callback)._vptr_request_callback;
    pcVar45 = "*** announce: event != stopped && m_paused";
  }
LAB_0031f860:
  (*pp_Var35[7])(this,pcVar45);
  return;
}

Assistant:

void torrent::announce_with_tracker(event_t e)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(e == event_t::stopped || state() != torrent_status::checking_files);
		INVARIANT_CHECK;

		if (m_trackers.empty())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: no trackers");
#endif
			return;
		}

		if (m_abort) e = event_t::stopped;

		// having stop_tracker_timeout <= 0 means that there is
		// no need to send any request to trackers or trigger any
		// related logic when the event is stopped
		if (e == event_t::stopped
			&& settings().get_int(settings_pack::stop_tracker_timeout) <= 0)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event == stopped && stop_tracker_timeout <= 0");
#endif
			return;
		}

		// if we're not announcing to trackers, only allow
		// stopping
		if (e != event_t::stopped && !m_announce_to_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event != stopped && !m_announce_to_trackers");
#endif
			return;
		}

		// if we're not allowing peers, there's no point in announcing
		if (e != event_t::stopped && m_paused)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event != stopped && m_paused");
#endif
			return;
		}

		TORRENT_ASSERT(!m_paused || e == event_t::stopped);

		if (e == event_t::none && is_finished() && !is_seed())
			e = event_t::paused;

		tracker_request req;
		if (settings().get_bool(settings_pack::apply_ip_filter_to_trackers)
			&& m_apply_ip_filter)
		{
			req.filter = m_ip_filter;
		}

		req.private_torrent = m_torrent_file->priv();

		req.pid = m_peer_id;
		req.downloaded = m_stat.total_payload_download() - m_total_failed_bytes;
		req.uploaded = m_stat.total_payload_upload();
		req.corrupt = m_total_failed_bytes;
		req.left = bytes_left().value_or(16 * 1024);
#ifdef TORRENT_SSL_PEERS
		// if this torrent contains an SSL certificate, make sure
		// any SSL tracker presents a certificate signed by it
		req.ssl_ctx = m_ssl_ctx.get();
#endif

		req.redundant = m_total_redundant_bytes;
		// exclude redundant bytes if we should
		if (!settings().get_bool(settings_pack::report_true_downloaded))
		{
			req.downloaded -= m_total_redundant_bytes;

			// if the torrent is complete we know that all incoming pieces will be
			// marked redundant so add them to the redundant count
			// this is mainly needed to cover the case where a torrent has just completed
			// but still has partially downloaded pieces
			// if the incoming pieces are not accounted for it could cause the downloaded
			// amount to exceed the total size of the torrent which upsets some trackers
			if (is_seed())
			{
				for (auto const& c : m_connections)
				{
					TORRENT_INCREMENT(m_iterating_connections);
					auto const pbp = c->downloading_piece_progress();
					if (pbp.bytes_downloaded > 0)
					{
						req.downloaded -= pbp.bytes_downloaded;
						req.redundant += pbp.bytes_downloaded;
					}
				}
			}
		}
		if (req.downloaded < 0) req.downloaded = 0;

		req.event = e;

		// since sending our IPv4/v6 address to the tracker may be sensitive. Only
		// do that if we're not in anonymous mode and if it's a private torrent
		if (!settings().get_bool(settings_pack::anonymous_mode)
			&& m_torrent_file
			&& m_torrent_file->priv())
		{
			m_ses.for_each_listen_socket([&](aux::listen_socket_handle const& s)
			{
				if (s.is_ssl() != is_ssl_torrent()) return;
				tcp::endpoint const ep = s.get_local_endpoint();
				if (ep.address().is_unspecified()) return;
				if (aux::is_v6(ep))
				{
					if (!aux::is_local(ep.address()) && !ep.address().is_loopback())
						req.ipv6.push_back(ep.address().to_v6());
				}
				else
				{
					if (!aux::is_local(ep.address()) && !ep.address().is_loopback())
						req.ipv4.push_back(ep.address().to_v4());
				}
			});
		}

		// if we are aborting. we don't want any new peers
		req.num_want = (req.event == event_t::stopped)
			? 0 : settings().get_int(settings_pack::num_want);

// some older versions of clang had a bug where it would fire this warning here
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol
		{ {
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		} };
#ifdef __clang__
#pragma clang diagnostic pop
#endif

		time_point32 const now = aux::time_now32();

		// each listen socket gets its own announce state
		// so that each one should get at least one announce
		std::vector<announce_state> listen_socket_states;

#ifndef TORRENT_DISABLE_LOGGING
		int idx = -1;
		if (should_log())
		{
			debug_log("*** announce: "
				"[ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
				, settings().get_bool(settings_pack::announce_to_all_tiers)
				, settings().get_bool(settings_pack::announce_to_all_trackers)
				, int(m_trackers.size()));
		}
#endif

		// TODO: it would be nice to raise the abstraction level of the
		// tracker_list or trackers a bit here
		for (auto& ae : m_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			++idx;
#endif
			refresh_endpoint_list(m_ses, is_ssl_torrent(), bool(m_complete_sent), ae);

			// if trackerid is not specified for tracker use default one, probably set explicitly
			req.trackerid = ae.trackerid.empty() ? m_trackerid : ae.trackerid;
			req.url = ae.url;

#if TORRENT_USE_I2P
			if (is_i2p_url(req.url))
			{
				req.kind |= tracker_request::i2p;
			}
			else if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			{
				// if we don't allow mixing normal peers into this i2p
				// torrent, skip this announce
				continue;
			}
#endif

			for (auto& aep : ae.endpoints)
			{
				// do not add code which continues to the next endpoint here!
				// listen_socket_states needs to be populated even if none of the endpoints
				// will be announcing for this tracker
				// otherwise the early bail out when neither announce_to_all_trackers
				// nor announce_to_all_tiers is set may be triggered prematurely

				auto aep_state_iter = std::find_if(listen_socket_states.begin(), listen_socket_states.end()
					, [&](announce_state const& s) { return s.socket == aep.socket; });
				if (aep_state_iter == listen_socket_states.end())
				{
					listen_socket_states.emplace_back(aep.socket);
					aep_state_iter = listen_socket_states.end() - 1;
				}
				announce_state& ep_state = *aep_state_iter;

				if (!aep.enabled) continue;

				for (protocol_version const ih : all_versions)
				{
					if (!supports_protocol[ih]) continue;

					auto& state = ep_state.state[ih];
					auto& a = aep.info_hashes[ih];

					// if we haven't sent an event=start to the tracker, there's no
					// point in sending an event=stopped
					if (!a.start_sent && req.event == event_t::stopped)
						continue;

					if (state.done) continue;

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("*** tracker:  (%d) [ep: %s ] \"%s\" [ "
							" i->tier: %d tier: %d working: %d limit: %d"
							" can: %d sent: %d ]"
							, idx, print_endpoint(aep.local_endpoint).c_str()
							, ae.url.c_str(), ae.tier, state.tier, a.is_working(), ae.fail_limit
							, a.can_announce(now, is_seed(), ae.fail_limit), state.sent_announce);
					}
#endif

					if (settings().get_bool(settings_pack::announce_to_all_tiers)
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& state.sent_announce
						&& ae.tier <= state.tier
						&& state.tier != INT_MAX)
						continue;

					if (ae.tier > state.tier && state.sent_announce
						&& !settings().get_bool(settings_pack::announce_to_all_tiers)) continue;
					if (a.is_working()) { state.tier = ae.tier; state.sent_announce = false; }
					if (!a.can_announce(now, is_seed(), ae.fail_limit))
					{
						// this counts
						if (a.is_working())
						{
							state.sent_announce = true;
							if (!settings().get_bool(settings_pack::announce_to_all_trackers)
								&& !settings().get_bool(settings_pack::announce_to_all_tiers))
							{
								state.done = true;
							}
						}
						continue;
					}

					req.event = e;
					if (req.event == event_t::none)
					{
						if (!a.start_sent) req.event = event_t::started;
						else if (!m_complete_sent
							&& !a.complete_sent
							&& is_seed())
						{
							req.event = event_t::completed;
						}
					}

					req.triggered_manually = a.triggered_manually;
					a.triggered_manually = false;

#if TORRENT_ABI_VERSION == 1
					req.auth = tracker_login();
#endif
					req.key = tracker_key();

					req.outgoing_socket = aep.socket;
					req.info_hash = m_torrent_file->info_hashes().get(ih);

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("==> TRACKER REQUEST \"%s\" event: %s abort: %d ssl: %p "
							"port: %d ssl-port: %d fails: %d upd: %d ep: %s"
							, req.url.c_str()
							, (req.event == event_t::stopped ? "stopped"
								: req.event == event_t::started ? "started" : "")
							, m_abort
#ifdef TORRENT_SSL_PEERS
							, static_cast<void*>(req.ssl_ctx)
#else
							, static_cast<void*>(nullptr)
#endif
							, m_ses.listen_port()
							, m_ses.ssl_listen_port()
							, a.fails
							, a.updating
							, print_endpoint(aep.local_endpoint).c_str());
					}

					// if we're not logging session logs, don't bother creating an
					// observer object just for logging
					if (m_abort && m_ses.should_log())
					{
						auto tl = std::make_shared<aux::tracker_logger>(m_ses);
						m_ses.queue_tracker_request(req, tl);
					}
					else
#endif
					{
						m_ses.queue_tracker_request(req, shared_from_this());
					}

					a.updating = true;
					a.next_announce = now;
					a.min_announce = now;

					if (m_ses.alerts().should_post<tracker_announce_alert>())
					{
						m_ses.alerts().emplace_alert<tracker_announce_alert>(
							get_handle(), aep.local_endpoint, req.url, ih, req.event);
					}

					state.sent_announce = true;
					if (a.is_working()
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& !settings().get_bool(settings_pack::announce_to_all_tiers))
					{
						state.done = true;
					}
				}
			}

			if (std::all_of(listen_socket_states.begin(), listen_socket_states.end()
				, [supports_protocol](announce_state const& s) {
					for (protocol_version const ih : all_versions)
					{
						if (supports_protocol[ih] && !s.state[ih].done)
							return false;
					}
					return true;
				}))
				break;
		}
		update_tracker_timer(now);
	}